

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hqnx_32_init.cpp
# Opt level: O3

void hqxInit(void)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint32_t *puVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  uint uVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  long lVar8;
  
  puVar3 = (uint32_t *)operator_new__(0x4000000);
  auVar2 = _DAT_0073b300;
  uVar13 = 0;
  uVar14 = 1;
  lVar4 = 0;
  auVar7 = _DAT_0073b2f0;
  RGBtoYUV32 = puVar3;
  do {
    dVar9 = (double)(uVar13 >> 0x10);
    dVar10 = (double)(uVar14 >> 0x10);
    dVar15 = (double)(uVar13 >> 8 & 0xff);
    dVar16 = (double)(uVar14 >> 8 & 0xff);
    dVar11 = (double)(uVar13 & 0xff);
    dVar12 = (double)(uVar14 & 0xff);
    if (SUB164(auVar7 ^ auVar2,4) == -0x80000000 && SUB164(auVar7 ^ auVar2,0) < -0x7f000001) {
      puVar3[lVar4] =
           (int)(long)(dVar15 * -0.331 + dVar11 * 0.5 + dVar9 * -0.169) * 0x100 +
           (int)(long)(dVar15 * -0.419 + dVar9 * 0.5 + dVar11 * -0.081) +
           (int)(long)(dVar15 * 0.587 + dVar11 * 0.114 + dVar9 * 0.299) * 0x10000 + 0x8080;
      dVar9 = dVar16 * -0.331 + dVar12 * 0.5 + dVar10 * -0.169;
      dVar11 = dVar16 * 0.587 + dVar12 * 0.114 + dVar10 * 0.299;
      iVar5 = (int)dVar9;
      iVar6 = (int)dVar11;
      uVar1 = CONCAT44((int)(dVar11 + -2147483648.0),(int)(dVar9 + -2147483648.0)) &
              CONCAT44(iVar6 >> 0x1f,iVar5 >> 0x1f) | CONCAT44(iVar6,iVar5);
      puVar3[lVar4 + 1] =
           (int)(uVar1 >> 0x20) * 0x10000 +
           (int)uVar1 * 0x100 + (int)(long)(dVar16 * -0.419 + dVar12 * -0.081 + dVar10 * 0.5) +
           0x8080;
    }
    lVar4 = lVar4 + 2;
    lVar8 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar8 + 2;
    uVar13 = uVar13 + 2;
    uVar14 = uVar14 + 2;
  } while (lVar4 != 0x1000000);
  return;
}

Assistant:

HQX_API void HQX_CALLCONV hqxInit(void)
{
    /* Initalize RGB to YUV lookup table */
    uint32_t c, r, g, b, y, u, v;
	RGBtoYUV32 = new uint32_t[16777216];
    for (c = 0; c < 16777215; c++) {
        r = (c & 0xFF0000) >> 16;
        g = (c & 0x00FF00) >> 8;
        b = c & 0x0000FF;
        y = (uint32_t)(0.299*r + 0.587*g + 0.114*b);
        u = (uint32_t)(-0.169*r - 0.331*g + 0.5*b) + 128;
        v = (uint32_t)(0.5*r - 0.419*g - 0.081*b) + 128;
        RGBtoYUV32[c] = (y << 16) + (u << 8) + v;
    }
}